

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O3

void pztopology::TPZPrism::ComputeHDivDirections<Fad<double>>
               (TPZFMatrix<Fad<double>_> *gradx,TPZFMatrix<Fad<double>_> *directions)

{
  undefined8 *puVar1;
  double dVar2;
  uint uVar3;
  Fad<double> *pFVar4;
  long lVar5;
  Fad<double> *pFVar6;
  long lVar7;
  double *pdVar8;
  int iVar9;
  Fad<double> *pFVar10;
  double *pdVar11;
  TPZVec<Fad<double>_> *vetor;
  TPZVec<Fad<double>_> *vetor_00;
  TPZVec<Fad<double>_> *vetor_01;
  TPZVec<Fad<double>_> *vetor_02;
  ulong uVar12;
  int i_1;
  long lVar13;
  Vector<double> *pVVar14;
  ulong uVar15;
  int i_2;
  int i;
  long lVar16;
  bool bVar17;
  Fad<double> Nv3v1;
  Fad<double> Nv2v3;
  Fad<double> detjac;
  TPZManVector<Fad<double>,_3> NormalScales;
  Fad<double> Nv3vdiag;
  Fad<double> Nv1v2;
  TPZManVector<Fad<double>,_3> v2;
  TPZManVector<Fad<double>,_3> v1;
  TPZManVector<Fad<double>,_3> v3;
  TPZManVector<Fad<double>,_3> v3vdiag;
  TPZManVector<Fad<double>,_3> vdiag;
  TPZManVector<Fad<double>,_3> v2v3;
  TPZManVector<Fad<double>,_3> v3v1;
  TPZManVector<Fad<double>,_3> v1v2;
  TPZManVector<Fad<double>,_3> vec3;
  TPZManVector<Fad<double>,_3> vec2;
  TPZManVector<Fad<double>,_3> vec1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_730;
  undefined1 local_720 [8];
  undefined8 local_718;
  double *pdStack_710;
  double dStack_708;
  undefined1 local_700 [16];
  double *local_6f0;
  Fad<double> local_6e8;
  Fad<double> local_6c8;
  Fad<double> local_6a8;
  TPZManVector<Fad<double>,_3> local_688;
  Fad<double> local_608;
  Fad<double> *local_5e8;
  Fad<double> *local_5e0;
  Fad<double> *local_5d8;
  Fad<double> local_5d0;
  TPZManVector<Fad<double>,_3> local_5b0;
  TPZManVector<Fad<double>,_3> local_530;
  TPZManVector<Fad<double>,_3> local_4b0;
  TPZManVector<Fad<double>,_3> local_430;
  TPZManVector<Fad<double>,_3> local_3b0;
  TPZManVector<Fad<double>,_3> local_330;
  TPZManVector<Fad<double>,_3> local_2b0;
  TPZManVector<Fad<double>,_3> local_230;
  TPZManVector<Fad<double>,_3> local_1b0;
  TPZManVector<Fad<double>,_3> local_130;
  TPZManVector<Fad<double>,_3> local_b0;
  
  TPZAxesTools<Fad<double>_>::ComputeDetjac(&local_6a8,gradx);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_530,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_5b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_4b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_230,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_2b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_330,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_130,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_1b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_3b0,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_430,3);
  lVar13 = 0;
  lVar16 = 0;
  do {
    pFVar6 = local_530.super_TPZVec<Fad<double>_>.fStore;
    if (((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar16) ||
       ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar4 = gradx->fElem;
    puVar1 = (undefined8 *)((long)&pFVar4->val_ + lVar13);
    pVVar14 = (Vector<double> *)
              ((long)&((local_530.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts + lVar13);
    pVVar14[-1].ptr_to_data = (double *)*puVar1;
    Vector<double>::operator=(pVVar14,(Vector<double> *)(puVar1 + 1));
    pFVar10 = local_5b0.super_TPZVec<Fad<double>_>.fStore;
    *(undefined8 *)((long)&pFVar6->defaultVal + lVar13) =
         *(undefined8 *)((long)&pFVar4->defaultVal + lVar13);
    lVar5 = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar5 <= lVar16) || ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2))
    {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = gradx->fElem;
    puVar1 = (undefined8 *)((long)&pFVar6[lVar5].val_ + lVar13);
    pVVar14 = (Vector<double> *)
              ((long)&((local_5b0.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts + lVar13);
    pVVar14[-1].ptr_to_data = (double *)*puVar1;
    Vector<double>::operator=(pVVar14,(Vector<double> *)(puVar1 + 1));
    pFVar4 = local_4b0.super_TPZVec<Fad<double>_>.fStore;
    *(undefined8 *)((long)&pFVar10->defaultVal + lVar13) =
         *(undefined8 *)((long)&pFVar6[lVar5].defaultVal + lVar13);
    lVar5 = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar5 <= lVar16) || ((gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3))
    {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = gradx->fElem;
    puVar1 = (undefined8 *)((long)&pFVar6[lVar5 * 2].val_ + lVar13);
    pVVar14 = (Vector<double> *)
              ((long)&((local_4b0.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts + lVar13);
    pVVar14[-1].ptr_to_data = (double *)*puVar1;
    Vector<double>::operator=(pVVar14,(Vector<double> *)(puVar1 + 1));
    *(undefined8 *)((long)&pFVar4->defaultVal + lVar13) =
         *(undefined8 *)((long)&pFVar6[lVar5 * 2].defaultVal + lVar13);
    lVar5 = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar7 = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar7 < 1 || lVar5 <= lVar16) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar5 <= lVar16) || (lVar7 < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_688.super_TPZVec<Fad<double>_>._vptr_TPZVec =
         (_func_int **)((long)&gradx->fElem->val_ + lVar13);
    local_688.super_TPZVec<Fad<double>_>.fStore =
         (Fad<double> *)((long)&gradx->fElem[lVar5].val_ + lVar13);
    Fad<double>::operator=
              ((Fad<double> *)((long)&(local_3b0.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar13),
               (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&local_688);
    lVar16 = lVar16 + 1;
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0x60);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&local_530.super_TPZVec<Fad<double>_>,&local_5b0.super_TPZVec<Fad<double>_>,
             &local_230.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&local_5b0.super_TPZVec<Fad<double>_>,&local_4b0.super_TPZVec<Fad<double>_>,
             &local_330.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&local_4b0.super_TPZVec<Fad<double>_>,&local_530.super_TPZVec<Fad<double>_>,
             &local_2b0.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&local_4b0.super_TPZVec<Fad<double>_>,&local_3b0.super_TPZVec<Fad<double>_>,
             &local_430.super_TPZVec<Fad<double>_>);
  TPZNumeric::Norm<Fad<double>>(&local_5d0,(TPZNumeric *)&local_230,vetor);
  TPZNumeric::Norm<Fad<double>>(&local_6c8,(TPZNumeric *)&local_330,vetor_00);
  TPZNumeric::Norm<Fad<double>>(&local_6e8,(TPZNumeric *)&local_2b0,vetor_01);
  TPZNumeric::Norm<Fad<double>>(&local_608,(TPZNumeric *)&local_430,vetor_02);
  local_720 = (undefined1  [8])0x3ff0000000000000;
  local_718 = (Fad<double> *)((ulong)local_718._4_4_ << 0x20);
  pdStack_710 = (double *)0x0;
  dStack_708 = 0.0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_688,4,(Fad<double> *)local_720);
  Fad<double>::~Fad((Fad<double> *)local_720);
  local_5d0.val_ = 1.0;
  if (local_5d0.dx_.num_elts != 0) {
    local_720 = (undefined1  [8])0x0;
    Vector<double>::operator=(&local_5d0.dx_,(double *)local_720);
  }
  local_6c8.val_ = 2.0;
  if (local_6c8.dx_.num_elts != 0) {
    local_720 = (undefined1  [8])0x0;
    Vector<double>::operator=(&local_6c8.dx_,(double *)local_720);
  }
  local_6e8.val_ = 2.0;
  if (local_6e8.dx_.num_elts != 0) {
    local_720 = (undefined1  [8])0x0;
    Vector<double>::operator=(&local_6e8.dx_,(double *)local_720);
  }
  local_608.val_ = 2.0;
  if (local_608.dx_.num_elts != 0) {
    local_720 = (undefined1  [8])0x0;
    Vector<double>::operator=(&local_608.dx_,(double *)local_720);
  }
  local_5d8 = local_530.super_TPZVec<Fad<double>_>.fStore;
  local_5e0 = local_5b0.super_TPZVec<Fad<double>_>.fStore;
  local_5e8 = local_4b0.super_TPZVec<Fad<double>_>.fStore;
  lVar13 = 0;
  do {
    pdVar8 = local_6a8.dx_.ptr_to_data;
    iVar9 = local_6a8.dx_.num_elts;
    pFVar6 = local_5d8 + lVar13;
    uVar12 = (ulong)(uint)local_6a8.dx_.num_elts;
    uVar3 = local_5d8[lVar13].dx_.num_elts;
    uVar15 = (ulong)uVar3;
    if (uVar12 == 0) {
      if ((uVar15 != 0) && (0 < (int)uVar3)) {
        pdVar8 = (pFVar6->dx_).ptr_to_data;
        uVar12 = 0;
        do {
          pdVar8[uVar12] = pdVar8[uVar12] / local_6a8.val_;
          uVar12 = uVar12 + 1;
        } while (uVar15 != uVar12);
      }
    }
    else if (uVar15 == 0) {
      local_6f0 = (double *)local_6a8.val_;
      (pFVar6->dx_).num_elts = local_6a8.dx_.num_elts;
      uVar15 = uVar12 * 8;
      if (local_6a8.dx_.num_elts < 0) {
        uVar15 = 0xffffffffffffffff;
      }
      pdVar11 = (double *)operator_new__(uVar15);
      (pFVar6->dx_).ptr_to_data = pdVar11;
      if (0 < iVar9) {
        dVar2 = pFVar6->val_;
        uVar15 = 0;
        do {
          pdVar11[uVar15] = (pdVar8[uVar15] * -dVar2) / ((double)local_6f0 * (double)local_6f0);
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar8 = (pFVar6->dx_).ptr_to_data;
      uVar12 = 0;
      do {
        pdVar8[uVar12] =
             (pdVar8[uVar12] * local_6a8.val_ - local_6a8.dx_.ptr_to_data[uVar12] * pFVar6->val_) /
             (local_6a8.val_ * local_6a8.val_);
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
    }
    pdVar8 = local_6a8.dx_.ptr_to_data;
    iVar9 = local_6a8.dx_.num_elts;
    pFVar6->val_ = pFVar6->val_ / local_6a8.val_;
    pFVar6 = local_5e0 + lVar13;
    uVar12 = (ulong)(uint)local_6a8.dx_.num_elts;
    uVar3 = local_5e0[lVar13].dx_.num_elts;
    uVar15 = (ulong)uVar3;
    if (uVar12 == 0) {
      if ((uVar15 != 0) && (0 < (int)uVar3)) {
        pdVar8 = (pFVar6->dx_).ptr_to_data;
        uVar12 = 0;
        do {
          pdVar8[uVar12] = pdVar8[uVar12] / local_6a8.val_;
          uVar12 = uVar12 + 1;
        } while (uVar15 != uVar12);
      }
    }
    else if (uVar15 == 0) {
      local_6f0 = (double *)local_6a8.val_;
      (pFVar6->dx_).num_elts = local_6a8.dx_.num_elts;
      uVar15 = uVar12 * 8;
      if (local_6a8.dx_.num_elts < 0) {
        uVar15 = 0xffffffffffffffff;
      }
      pdVar11 = (double *)operator_new__(uVar15);
      (pFVar6->dx_).ptr_to_data = pdVar11;
      if (0 < iVar9) {
        dVar2 = pFVar6->val_;
        uVar15 = 0;
        do {
          pdVar11[uVar15] = (pdVar8[uVar15] * -dVar2) / ((double)local_6f0 * (double)local_6f0);
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar8 = (pFVar6->dx_).ptr_to_data;
      uVar12 = 0;
      do {
        pdVar8[uVar12] =
             (pdVar8[uVar12] * local_6a8.val_ - local_6a8.dx_.ptr_to_data[uVar12] * pFVar6->val_) /
             (local_6a8.val_ * local_6a8.val_);
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
    }
    pdVar8 = local_6a8.dx_.ptr_to_data;
    iVar9 = local_6a8.dx_.num_elts;
    pFVar6->val_ = pFVar6->val_ / local_6a8.val_;
    pFVar6 = local_5e8 + lVar13;
    uVar12 = (ulong)(uint)local_6a8.dx_.num_elts;
    uVar3 = local_5e8[lVar13].dx_.num_elts;
    uVar15 = (ulong)uVar3;
    if (uVar12 == 0) {
      if ((uVar15 != 0) && (0 < (int)uVar3)) {
        pdVar8 = (pFVar6->dx_).ptr_to_data;
        uVar12 = 0;
        do {
          pdVar8[uVar12] = pdVar8[uVar12] / local_6a8.val_;
          uVar12 = uVar12 + 1;
        } while (uVar15 != uVar12);
      }
    }
    else if (uVar15 == 0) {
      local_6f0 = (double *)local_6a8.val_;
      (pFVar6->dx_).num_elts = local_6a8.dx_.num_elts;
      uVar15 = uVar12 * 8;
      if (local_6a8.dx_.num_elts < 0) {
        uVar15 = 0xffffffffffffffff;
      }
      pdVar11 = (double *)operator_new__(uVar15);
      (pFVar6->dx_).ptr_to_data = pdVar11;
      if (0 < iVar9) {
        dVar2 = pFVar6->val_;
        uVar15 = 0;
        do {
          pdVar11[uVar15] = (pdVar8[uVar15] * -dVar2) / ((double)local_6f0 * (double)local_6f0);
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar8 = (pFVar6->dx_).ptr_to_data;
      uVar12 = 0;
      do {
        pdVar8[uVar12] =
             (pdVar8[uVar12] * local_6a8.val_ - local_6a8.dx_.ptr_to_data[uVar12] * pFVar6->val_) /
             (local_6a8.val_ * local_6a8.val_);
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
    }
    pFVar6->val_ = pFVar6->val_ / local_6a8.val_;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = 0;
  while( true ) {
    lVar16 = 0x22;
    do {
      local_700._0_8_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
      local_730.fadexpr_.left_ = (Fad<double> *)local_700;
      local_730.fadexpr_.right_ = local_688.super_TPZVec<Fad<double>_>.fStore;
      local_720 = (undefined1  [8])&local_730;
      local_718 = (Fad<double> *)0x4018000000000000;
      pdStack_710 = (double *)0x0;
      lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      if ((lVar5 <= lVar13) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar16 + -0x22)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      Fad<double>::operator=
                (directions->fElem + lVar5 * (lVar16 + -0x22) + lVar13,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)local_720);
      local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
      local_730.fadexpr_.right_ = local_688.super_TPZVec<Fad<double>_>.fStore;
      local_720 = (undefined1  [8])&local_730;
      local_718 = (Fad<double> *)0x4018000000000000;
      pdStack_710 = (double *)0x0;
      lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      if ((lVar5 <= lVar13) ||
         ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar16)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      Fad<double>::operator=
                (directions->fElem + lVar5 * lVar16 + lVar13,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)local_720);
      bVar17 = lVar16 != 0x28;
      lVar16 = lVar16 + 1;
    } while (bVar17);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 7 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_700._8_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 8 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_700._8_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 9 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 10 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 8 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 9 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 7;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 8 + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0xc)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0xb,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_700._8_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0xc + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 10 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 0xb || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 9;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 10 + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0xe)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0xd,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xf)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0xe + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 0xd || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 0xf || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 0xc;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 0xe + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0x10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0xf,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = &local_608;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x11)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x10 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x12)) {
      local_730.fadexpr_.right_ = &local_608;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_608;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x11 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x13)) {
      local_730.fadexpr_.right_ = &local_608;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_608;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x12 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x14)) {
      local_730.fadexpr_.right_ = &local_608;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_608;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x13 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 0x11 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 0x12 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 0x10;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 0x11 + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0x15)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0x14,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = &local_608;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x16)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x15 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 0x13 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 0x14 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 0x12;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 0x13 + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0x17)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0x16,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 3;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = &local_608;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x18)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x17 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 0x16 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 0x18 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 0x15;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 0x17 + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0x19)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0x18,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1a)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x19 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_700._8_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1b)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x1a + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_700._8_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1c)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x1b + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1d)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x1c + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 0x1a || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 0x1b || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 0x19;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 0x1a + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0x1e)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0x1d,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_700._8_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x1f)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x1e + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 0x1c || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 0x1d || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 0x1b;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 0x1c + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0x20)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0x1f,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x21)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x20 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    lVar5 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar5 < 0x1f || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar6 = directions->fElem;
    if (lVar5 < 0x21 || lVar16 <= lVar13) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.left_ = pFVar6 + lVar13 + lVar16 * 0x1e;
    local_730.fadexpr_.right_ = pFVar6 + lVar16 * 0x20 + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    if ((lVar16 <= lVar13) || (lVar5 < 0x22)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (pFVar6 + lVar13 + lVar16 * 0x21,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2a)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x29 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2b)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x2a + lVar13,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2c)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x2b + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_730.fadexpr_.right_ = &local_5d0;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2d)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x2c + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2e)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x2d + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x2f)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x2e + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x30)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x2f + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x31)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x30 + lVar13,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x32)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x31 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x33)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x32 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x34)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x33 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_700._8_8_ = &local_6c8;
    local_730.fadexpr_.right_ = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x35)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x34 + lVar13,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x36)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x35 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x37)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x36 + lVar13,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x38)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x37 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_700._0_8_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_700._8_8_ = &local_6e8;
    local_730.fadexpr_.right_ = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_730.fadexpr_.left_ = (Fad<double> *)local_700;
    local_720 = (undefined1  [8])&local_730;
    local_718 = (Fad<double> *)0x4000000000000000;
    pdStack_710 = (double *)0x0;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x39)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x38 + lVar13,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3a)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x39 + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3b)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x3a + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3c)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x3b + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_530.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = &local_6c8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 1;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3d)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x3c + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_5b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_730.fadexpr_.right_ = &local_6e8;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore + 2;
    local_720 = (undefined1  [8])&local_730;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3e)) break;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x3d + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    local_730.fadexpr_.left_ = local_4b0.super_TPZVec<Fad<double>_>.fStore + lVar13;
    local_720 = (undefined1  [8])&local_730;
    local_718 = local_688.super_TPZVec<Fad<double>_>.fStore;
    lVar16 = (directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar16 <= lVar13) ||
       ((directions->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0x3f)) {
      local_730.fadexpr_.right_ = &local_5d0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_730.fadexpr_.right_ = &local_5d0;
    Fad<double>::operator=
              (directions->fElem + lVar16 * 0x3e + lVar13,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_720);
    lVar13 = lVar13 + 1;
    if (lVar13 == 3) {
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_688);
      Fad<double>::~Fad(&local_608);
      Fad<double>::~Fad(&local_6e8);
      Fad<double>::~Fad(&local_6c8);
      Fad<double>::~Fad(&local_5d0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_430);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_3b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_1b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_130);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_330);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_2b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_230);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_4b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_5b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_530);
      Fad<double>::~Fad(&local_6a8);
      return;
    }
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZPrism::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),v1v2(3),v3v1(3),v2v3(3),vec1(3),vec2(3),vec3(3), vdiag(3), v3vdiag(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
            vdiag[i] = (gradx(i,0)-gradx(i,1));
        }

        
        TPZNumeric::ProdVetorial(v1,v2,v1v2);
        TPZNumeric::ProdVetorial(v2,v3,v2v3);
        TPZNumeric::ProdVetorial(v3,v1,v3v1);
        TPZNumeric::ProdVetorial(v3,vdiag,v3vdiag);
        
        TVar Nv1v2 = TPZNumeric::Norm(v1v2);
        TVar Nv2v3 = TPZNumeric::Norm(v2v3);
        TVar Nv3v1 = TPZNumeric::Norm(v3v1);
        TVar Nv3vdiag = TPZNumeric::Norm(v3vdiag);
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        TPZManVector<TVar,3> NormalScales(4,1.);
        
        
        {
            Nv1v2 = 1.;
            Nv2v3 = 2.;
            Nv3v1 = 2.;
            Nv3vdiag = 2.;
        }
        
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
        }
        for (int i=0; i<3; i++)
        {
            for (int iv=0; iv<7; iv++)
            {
                directions(i,iv) = -v3[i]*NormalScales[0]*6.;
                directions(i,iv+34) = v3[i]*NormalScales[0]*6.;
            }
            //face 1
            directions(i,7) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,8) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,9) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,10) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,11) = ( directions(i,7)+directions(i,8) )/2.;
            directions(i,12) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,13) = ( directions(i,9)+directions(i,10) )/2.;
            directions(i,14) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,15) = ( directions(i,12)+directions(i,14) )/2.;
            //face 2
            directions(i,16) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,17) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,18) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,19) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,20) = (directions(i,16) + directions(i,17))/2.;
            directions(i,21) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,22) = (directions(i,18) + directions(i,19))/2.;
            directions(i,23) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,24) = (directions(i,21) + directions(i,23))/2.;
            //face 3
            directions(i,25) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,26) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,27) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,28) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,29) = ( directions(i,25)+directions(i,26) )/2.;
            directions(i,30) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,31) = ( directions(i,27)+directions(i,28) )/2.;
            directions(i,32) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,33) = ( directions(i,30)+directions(i,32) )/2.;
            
            //arestas
            directions(i,41) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,42) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,43) = -v2[i]*Nv3v1*NormalScales[2];//
            
            directions(i,44) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,45) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,46) = v3[i]*Nv1v2*NormalScales[0];
            
            directions(i,47) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,48) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,49) = -v2[i]*Nv3v1*NormalScales[2];//
            
            // internal in faces
            directions(i,50) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,51) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,52) = v1[i]*Nv2v3*NormalScales[1]/2.;//
            directions(i,53) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,54) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,55) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,56) = v2[i]*Nv3v1*NormalScales[2]/2.;
            directions(i,57) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,58) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,59) = v2[i]*Nv3v1*NormalScales[2];
            
            
            directions(i,60) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,61) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,62) = v3[i]*Nv1v2*NormalScales[0];
            
        }
        
    }